

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.c
# Opt level: O1

int main(void)

{
  _Bool *word;
  tester_t *ptVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  __pid_t _Var5;
  tester_t *ptVar6;
  ssize_t sVar7;
  tester_list *ptVar8;
  bool bVar9;
  undefined1 local_45c [8];
  validator_mq_msg validator_msg;
  char parent_pid_str [12];
  int wait_ret;
  int local_38;
  int local_34;
  
  main_pid = getpid();
  children = pid_list_create(&err);
  if (err == true) {
    main_cold_12();
LAB_00102091:
    main_cold_11();
LAB_00102096:
    main_cold_10();
  }
  else {
    iVar3 = sigemptyset((sigset_t *)&err_action.sa_mask);
    if (iVar3 == -1) {
LAB_001019bf:
      err = true;
      log_formatted("Fail in %s, function: %s",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/validator.c"
                    ,"setup_sig_handlers");
    }
    else {
      err_action.sa_flags = 0;
      err_action.__sigaction_handler.sa_handler = sig_err_handler;
      iVar3 = sigaction(2,(sigaction *)&err_action,(sigaction *)0x0);
      if (((iVar3 == -1) ||
          (iVar3 = sigaction(0xf,(sigaction *)&err_action,(sigaction *)0x0), iVar3 == -1)) ||
         (iVar3 = sigemptyset((sigset_t *)&snt_success_action.sa_mask), iVar3 == -1))
      goto LAB_001019bf;
      snt_success_action.sa_flags = 0x10000000;
      snt_success_action.__sigaction_handler.sa_handler = sig_snt_success_handler;
      iVar3 = __libc_current_sigrtmin();
      iVar3 = sigaction(iVar3 + 1,(sigaction *)&snt_success_action,(sigaction *)0x0);
      if (iVar3 == -1) goto LAB_001019bf;
    }
    if (err == true) goto LAB_00102091;
    tester_data = tester_list_create(&err);
    if (err == true) goto LAB_00102096;
    load_automaton(&a,&err);
    if (err != true) {
      validator_mq = validator_mq_start(true,&err);
      if (err != true) {
        if (halt_flag_raised == '\0') {
          do {
            validator_mq_receive(validator_mq,(validator_mq_msg *)local_45c,&err);
            if (err == true) {
              main_cold_1();
            }
            ptVar6 = tester_for_request((validator_mq_msg *)local_45c);
            uVar4 = getpid();
            log_formatted("%d RCD: %s, completed=%d, finish=%d, for TESTER IN LIST: %d, bal=%d, completed=%d, expected_rcd=%d"
                          ,(ulong)uVar4,&validator_msg.accepted,(ulong)local_45c[2],
                          (ulong)(byte)local_45c[3],(ulong)(uint)ptVar6->pid,
                          (ulong)(uint)ptVar6->word_bal,(ulong)ptVar6->completed,ptVar6->rcd);
            if ((_Bool)local_45c[0] == true) {
              comm_summary.rcd = comm_summary.rcd + 1;
              ptVar6->rcd = ptVar6->rcd + 1;
              ptVar6->word_bal = ptVar6->word_bal + 1;
              ptVar6->completed = (_Bool)local_45c[2];
              local_45c[0] = false;
              local_45c[3] = true;
              local_45c[4] = false;
              iVar3 = pipe(&local_38);
              if ((err == false) && (iVar3 != -1)) {
                _Var5 = fork();
                if (_Var5 == -1) {
                  err = true;
                }
                else {
                  if (_Var5 == 0) {
                    validator_mq_finish(false,validator_mq,&err);
                    if (err == true) {
                      kill(main_pid,0xf);
                    }
                    iVar3 = close(0);
                    if ((((iVar3 == 0) && (iVar3 = dup(local_38), iVar3 == 0)) &&
                        (iVar3 = close(local_38), iVar3 == 0)) &&
                       (iVar3 = close(local_34), iVar3 == 0)) {
                      sprintf(validator_msg.word + 0x3e4,"%d",(ulong)(uint)main_pid);
                      parent_pid_str._4_8_ = (long)"./run" + 2;
                      execvp("./run",(char **)(parent_pid_str + 4));
                    }
                    exit(1);
                  }
                  await_forks = await_forks + 1;
                  await_runs = await_runs + 1;
                  pid_list_emplace(children,_Var5,&err);
                }
                iVar3 = close(local_38);
                if ((err == false) && (iVar3 != -1)) {
                  _Var5 = fork();
                  if (_Var5 == -1) {
                    err = true;
                  }
                  else {
                    if (_Var5 == 0) goto LAB_001020a5;
                    await_forks = await_forks + 1;
                    pid_list_emplace(children,_Var5,&err);
                  }
                  iVar3 = close(local_34);
                  if ((err != false) || (err = false, iVar3 == -1)) goto LAB_00101f8f;
                }
                else {
                  err = true;
                  close(local_34);
                }
              }
              else {
LAB_00101f8f:
                err = true;
              }
joined_r0x00101f6b:
              if (err != false) {
LAB_00101ed4:
                main_cold_3();
              }
            }
            else if ((_Bool)local_45c[1] == true) {
              halt_flag_raised = '\x01';
              ptVar6->completed = true;
              for (ptVar8 = tester_data->next; ptVar8 != (tester_list *)0x0; ptVar8 = ptVar8->next)
              {
                ptVar1 = ptVar8->this;
                if ((ptVar1->word_bal == 0) && (ptVar1->completed_sent == false)) {
                  ptVar6->completed_sent = true;
                  async_send_to_tester(ptVar1->pid,(char *)0x0,true,ptVar1->rcd,true,false);
                  if (err == true) {
                    main_cold_2();
                  }
                }
              }
            }
            else {
              if ((_Bool)local_45c[3] == true) {
                await_runs = await_runs - 1;
                iVar3 = ptVar6->word_bal + -1;
                ptVar6->word_bal = iVar3;
                if ((_Bool)local_45c[4] == true) {
                  comm_summary.acc = comm_summary.acc + 1;
                  ptVar6->acc = ptVar6->acc + 1;
                }
                if ((iVar3 == 0 & ptVar6->completed) == 1) {
                  bVar2 = ptVar6->completed_sent ^ 1;
                }
                else {
                  bVar2 = false;
                }
                if ((_Bool)bVar2 != false) {
                  ptVar6->completed_sent = true;
                }
                async_send_to_tester
                          (ptVar6->pid,&validator_msg.accepted,(_Bool)bVar2,ptVar6->rcd,false,
                           (_Bool)local_45c[4]);
                goto joined_r0x00101f6b;
              }
              ptVar6->completed = (_Bool)local_45c[2];
              if (((_Bool)local_45c[2] == true) && (ptVar6->word_bal == 0)) {
                bVar2 = ptVar6->completed_sent ^ 1;
              }
              else {
                bVar2 = false;
              }
              if ((_Bool)bVar2 != false) {
                ptVar6->completed_sent = true;
              }
              async_send_to_tester
                        (ptVar6->pid,(char *)0x0,(_Bool)bVar2,ptVar6->rcd,true,(_Bool)local_45c[4]);
              if (err == true) goto LAB_00101ed4;
            }
          } while (halt_flag_raised == '\0');
        }
        if (await_runs != 0) {
          word = &validator_msg.accepted;
          do {
            validator_mq_receive(validator_mq,(validator_mq_msg *)local_45c,&err);
            if (err == true) {
              main_cold_4();
            }
            ptVar6 = tester_for_request((validator_mq_msg *)local_45c);
            uVar4 = getpid();
            log_formatted("%d RCD: %s, completed=%d, finish=%d, for TESTER IN LIST: %d, bal=%d, completed=%d, expected_rcd=%d"
                          ,(ulong)uVar4,word,(ulong)local_45c[2],(ulong)(byte)local_45c[3],
                          (ulong)(uint)ptVar6->pid,(ulong)(uint)ptVar6->word_bal,
                          (ulong)ptVar6->completed,ptVar6->rcd);
            if ((_Bool)local_45c[3] == true) {
              await_runs = await_runs - 1;
              iVar3 = ptVar6->word_bal + -1;
              ptVar6->word_bal = iVar3;
              if ((_Bool)local_45c[4] == true) {
                comm_summary.acc = comm_summary.acc + 1;
                ptVar6->acc = ptVar6->acc + 1;
              }
              async_send_to_tester
                        (ptVar6->pid,word,iVar3 == 0,ptVar6->rcd,false,(_Bool)local_45c[4]);
              if (err != false) {
LAB_00101ba6:
                main_cold_5();
              }
            }
            else {
              if (ptVar6->word_bal == 0) {
                bVar2 = ptVar6->completed_sent ^ 1;
              }
              else {
                bVar2 = false;
              }
              if ((_Bool)bVar2 != false) {
                ptVar6->completed_sent = true;
              }
              async_send_to_tester(ptVar6->pid,word,(_Bool)bVar2,ptVar6->rcd,true,false);
              if (err == true) goto LAB_00101ba6;
            }
          } while (await_runs != 0);
        }
        if (await_forks != 0) {
          do {
            parent_pid_str._4_8_ = parent_pid_str._4_8_ & 0xffffffff00000000;
            _Var5 = wait(parent_pid_str + 4);
            bVar9 = parent_pid_str._4_4_ == 0;
            if (bVar9 && _Var5 != -1) {
              await_forks = await_forks - 1;
            }
            else {
              err = true;
              log_formatted("Fail in %s, function: %s",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/validator.c"
                            ,"collect_forks");
            }
          } while ((bVar9 && _Var5 != -1) && await_forks != 0);
        }
        if (err == true) {
          main_cold_6();
        }
        validator_mq_finish(true,validator_mq,&err);
        if (err == true) {
          main_cold_7();
        }
        print_comm_summary(&comm_summary,true);
        tester_list_print_log(tester_data);
        tester_list_destroy(tester_data);
        pid_list_destroy(children);
        return 0;
      }
      goto LAB_001020a0;
    }
  }
  main_cold_9();
LAB_001020a0:
  main_cold_8();
LAB_001020a5:
  validator_mq_finish(false,validator_mq,&err);
  if (err == true) {
    kill(main_pid,0xf);
  }
  sVar7 = write(local_34,&a,0x40c88);
  if (sVar7 != 0x40c88) {
    kill(main_pid,0xf);
  }
  sVar7 = write(local_34,local_45c,0x3f8);
  if (sVar7 != 0x3f8) {
    kill(main_pid,0xf);
  }
  iVar3 = close(local_34);
  if (iVar3 == -1) {
    kill(main_pid,0xf);
  }
  exit(0);
}

Assistant:

int main() {
    assert(err == false);
    // initial setup
    main_pid = getpid();
    children = pid_list_create(&err);
    HANDLE_ERR_EXIT_WITH_MSG("Failed to create list of children pids");
    setup_sig_handlers(&err);
    HANDLE_ERR_EXIT_WITH_MSG("Failed to set up signal handlers");
    tester_data = tester_list_create(&err);
    HANDLE_ERR_EXIT_WITH_MSG("Failed to create tester list");
    load_automaton(&a, &err);
    HANDLE_ERR_EXIT_WITH_MSG("Failed to load automaton");

    // setup queues
    validator_mq = validator_mq_start(true, &err);
    HANDLE_ERR_EXIT_WITH_MSG("Failed to start validator MQ");

    // handle incoming requests
    validator_mq_msg validator_msg;
    while(!halt_flag_raised) {
        validator_mq_receive(validator_mq, &validator_msg, &err);
        HANDLE_ERR_WITH_MSG(kill_all_exit, "Failed to receive message from validator mq");

        tester_t *tester = tester_for_request(&validator_msg);
        handle_request_standard(tester, &validator_msg);
    }
    // after halt flag is raised, wait for runs to complete and ignore other testers if necessary
    while(await_runs) {
        validator_mq_receive(validator_mq, &validator_msg, &err);
        HANDLE_ERR_WITH_MSG(kill_all_exit, "Failed to receive message from validator mq");

        tester_t *tester = tester_for_request(&validator_msg);
        handle_request_only_finish(tester, &validator_msg);
    }
    // clean up
    collect_forks(&err);
    HANDLE_ERR_WITH_MSG(kill_all_exit, "Failed to collect forks created for async tasks");

    validator_mq_finish(true, validator_mq, &err);
    HANDLE_ERR_WITH_MSG(kill_all_exit, "Failed to close validator MQ");

    print_comm_summary(&comm_summary, true);
    tester_list_print_log(tester_data);
    tester_list_destroy(tester_data);
    pid_list_destroy(children);
    return 0;
}